

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

void __thiscall optimization::common_expr_del::BlockNodes::~BlockNodes(BlockNodes *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->exportQueue).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->exportQueue) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::_Select1st<std::pair<const_unsigned_int,_bool>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
  ::~_Rb_tree(&(this->added)._M_t);
  std::
  _Rb_tree<optimization::common_expr_del::Node,_std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>,_std::_Select1st<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
  ::~_Rb_tree(&(this->node_map)._M_t);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
  ::~_Rb_tree(&(this->var_map)._M_t);
  std::
  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
  ::~vector(&this->nodes);
  return;
}

Assistant:

~BlockNodes() {}